

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_outputter.hpp
# Opt level: O3

void hayai::Outputter::WriteTestNameToStream
               (ostream *stream,string *fixtureName,string *testName,
               TestParametersDescriptor *parameters)

{
  ostream *poVar1;
  long lVar2;
  ulong uVar3;
  pointer pTVar4;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(fixtureName->_M_dataplus)._M_p,fixtureName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(testName->_M_dataplus)._M_p,testName->_M_string_length);
  if ((parameters->_parameters).
      super__Vector_base<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (parameters->_parameters).
      super__Vector_base<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"(",1);
    pTVar4 = (parameters->_parameters).
             super__Vector_base<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((parameters->_parameters).
        super__Vector_base<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
        ._M_impl.super__Vector_impl_data._M_finish != pTVar4) {
      lVar2 = 0;
      uVar3 = 0;
      do {
        if (uVar3 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(stream,", ",2);
          pTVar4 = (pointer)((long)&(((parameters->_parameters).
                                      super__Vector_base<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->Declaration).
                                    _M_dataplus + lVar2);
        }
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,(pTVar4->Declaration)._M_dataplus._M_p,
                            (pTVar4->Declaration)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,(pTVar4->Value)._M_dataplus._M_p,(pTVar4->Value)._M_string_length);
        uVar3 = uVar3 + 1;
        pTVar4 = (parameters->_parameters).
                 super__Vector_base<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar2 = lVar2 + 0x40;
      } while (uVar3 < (ulong)((long)(parameters->_parameters).
                                     super__Vector_base<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4 >> 6)
              );
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,")",1);
    return;
  }
  return;
}

Assistant:

static void WriteTestNameToStream(std::ostream& stream,
                                          const std::string& fixtureName,
                                          const std::string& testName,
                                          const TestParametersDescriptor&
                                              parameters)
        {
            stream << fixtureName << "." << testName;

            const std::vector<TestParameterDescriptor>& descs =
                parameters.Parameters();

            if (descs.empty())
                return;

            stream << "(";

            for (std::size_t i = 0; i < descs.size(); ++i)
            {
                if (i)
                    stream << ", ";

                const TestParameterDescriptor& desc = descs[i];
                stream << desc.Declaration << " = " << desc.Value;
            }

            stream << ")";
        }